

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_from_string(netaddr *dst,char *src)

{
  undefined2 uVar1;
  ushort uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  ushort **ppuVar9;
  ulong uVar10;
  size_t sVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  netaddr *bin;
  uint *__s;
  uint *puVar19;
  char *__nptr;
  int iVar20;
  bool bVar21;
  size_t sStack_c0;
  char *ptr3;
  uint local_98 [10];
  netaddr_str buf;
  
  dst->_type = '\0';
  dst->_prefix_len = '\0';
  dst->_addr[0] = '\0';
  dst->_addr[1] = '\0';
  dst->_addr[2] = '\0';
  dst->_addr[3] = '\0';
  dst->_addr[4] = '\0';
  dst->_addr[5] = '\0';
  dst->_addr[6] = '\0';
  dst->_addr[7] = '\0';
  dst->_addr[8] = '\0';
  dst->_addr[9] = '\0';
  dst->_addr[10] = '\0';
  dst->_addr[0xb] = '\0';
  dst->_addr[0xc] = '\0';
  dst->_addr[0xd] = '\0';
  dst->_addr[0xe] = '\0';
  dst->_addr[0xf] = '\0';
  if ((*src != '-') || (src[1] != '\0')) {
    lVar17 = 0;
    do {
      lVar15 = lVar17;
      if (lVar15 + 0x10 == 0x60) {
        strscpy(buf.buf,src,0x3e);
        pcVar8 = str_trim(buf.buf);
        iVar7 = 0;
        iVar20 = 0;
        bVar6 = false;
        bVar5 = false;
        bVar21 = false;
        __nptr = pcVar8;
        goto LAB_0012511e;
      }
      iVar7 = strcasecmp(src,*(char **)((long)&_known_prefixes[0].name + lVar15));
      lVar17 = lVar15 + 0x10;
    } while (iVar7 != 0);
    puVar3 = *(undefined8 **)((long)&_known_prefixes[0].prefix + lVar15);
    uVar1 = *(undefined2 *)(puVar3 + 2);
    dst->_type = (char)uVar1;
    dst->_prefix_len = (char)((ushort)uVar1 >> 8);
    uVar4 = puVar3[1];
    *(undefined8 *)dst->_addr = *puVar3;
    *(undefined8 *)(dst->_addr + 8) = uVar4;
  }
  return 0;
LAB_0012511e:
  cVar12 = *__nptr;
  lVar17 = (long)cVar12;
  if (lVar17 == 0) goto LAB_00125180;
  ppuVar9 = __ctype_b_loc();
  uVar2 = (*ppuVar9)[lVar17];
  if ((cVar12 == '/') || ((uVar2 & 0x2000) != 0)) goto LAB_0012518f;
  if (cVar12 == '-') {
    iVar20 = iVar20 + 1;
  }
  else if (cVar12 == '.') {
    bVar5 = true;
  }
  else if (cVar12 == ':') {
    if (bVar21) {
      bVar6 = true;
    }
    iVar7 = iVar7 + 1;
  }
  __nptr = __nptr + 1;
  bVar21 = cVar12 == ':';
  goto LAB_0012511e;
LAB_00125180:
  uVar13 = 0xffffffff;
  goto LAB_001251f6;
LAB_0012518f:
  while ((uVar2 >> 0xd & 1) != 0) {
    *__nptr = '\0';
    lVar17 = (long)__nptr[1];
    __nptr = __nptr + 1;
    uVar2 = (*ppuVar9)[lVar17];
  }
  if ((char)lVar17 != '/') goto LAB_001251b6;
  do {
    *__nptr = '\0';
    __nptr = __nptr + 1;
LAB_001251b6:
  } while ((*(byte *)((long)*ppuVar9 + (long)*__nptr * 2 + 1) & 0x20) != 0);
  if (*__nptr == '\0') goto LAB_00125340;
  uVar10 = strtoul(__nptr,&ptr3,10);
  uVar13 = (uint)uVar10;
  if (ptr3 != (char *)0x0) {
    uVar13 = -(uint)(*ptr3 != '\0') | uVar13;
  }
LAB_001251f6:
  if ((((iVar20 != 5 && iVar7 != 5) || (iVar20 != 0 && iVar7 != 0)) || (bVar5)) || (bVar6)) {
    if (!(bool)(iVar7 != 0 | bVar5 | iVar20 != 7)) {
      dst->_type = '0';
      dst->_prefix_len = '@';
      dst->_addr[7] = '\x02';
      sStack_c0 = 8;
      goto LAB_001252e8;
    }
    if (!(bool)(iVar7 == 0 & bVar5 & iVar20 == 0)) {
      if ((bool)((bVar6 | iVar7 == 7) & iVar20 == 0)) {
        dst->_type = '\n';
        dst->_prefix_len = 0x80;
        iVar7 = inet_pton(10,pcVar8,dst);
        uVar18 = (uint)(iVar7 != 1);
LAB_0012533a:
        iVar7 = -uVar18;
      }
      else {
        if ((iVar7 != 0 || iVar20 != 4) || bVar5) goto LAB_00125340;
        dst->_type = '1';
        dst->_prefix_len = 0x80;
        sVar11 = strlen(pcVar8);
        iVar7 = -1;
        if (sVar11 < 0x25) {
          strscpy((char *)local_98,pcVar8,0x25);
          bin = dst;
          __s = local_98;
          for (lVar17 = 0; lVar17 != 0x28; lVar17 = lVar17 + 8) {
            pcVar8 = strchr((char *)__s,0x2d);
            if (pcVar8 == (char *)0x0) {
              if (lVar17 == 0x20) {
                puVar19 = (uint *)0x0;
                goto LAB_001253f2;
              }
LAB_00125450:
              iVar7 = -1;
              goto LAB_0012533c;
            }
            puVar19 = (uint *)(pcVar8 + 1);
            *pcVar8 = '\0';
LAB_001253f2:
            sVar11 = strlen((char *)__s);
            if (sVar11 != *(size_t *)((long)&_uuid_from_string_max_group_len + lVar17))
            goto LAB_00125450;
            iVar7 = _bin_from_hex(bin,sVar11 >> 1,(char *)__s,'\0');
            if (iVar7 != 0) goto LAB_00125450;
            bin = (netaddr *)(bin->_addr + (sVar11 >> 1));
            __s = puVar19;
          }
          iVar7 = 0;
        }
      }
      goto LAB_0012533c;
    }
    dst->_type = '\x02';
    dst->_prefix_len = ' ';
    iVar7 = inet_pton(2,pcVar8,dst);
    if (iVar7 != 1) goto LAB_00125340;
    cVar12 = *__nptr;
    if ((cVar12 != '\0') && (uVar13 == 0xffffffff)) {
      uVar18 = (uint)(iVar7 != 1);
      iVar7 = inet_pton(2,__nptr,local_98);
      if (iVar7 == 1) {
        uVar14 = 0x1f;
        for (uVar16 = 0xffffffff;
            (uVar13 = 0xffffffff, -1 < (int)uVar14 &&
            (uVar13 = uVar14,
            (local_98[0] >> 0x18 | (local_98[0] & 0xff0000) >> 8 | (local_98[0] & 0xff00) << 8 |
            local_98[0] << 0x18) != uVar16)); uVar16 = uVar16 * 2) {
          uVar14 = uVar14 - 1;
        }
      }
      else {
        sStack_c0._0_4_ = 0xffffffff;
        uVar13 = (uint)sStack_c0;
      }
      goto LAB_0012533a;
    }
  }
  else {
    dst->_type = '/';
    dst->_prefix_len = '0';
    sStack_c0 = 6;
    if (iVar7 == 0) {
LAB_001252e8:
      cVar12 = '-';
    }
    else {
      cVar12 = ':';
    }
    iVar7 = _bin_from_hex(dst,sStack_c0,pcVar8,cVar12);
LAB_0012533c:
    if (iVar7 != 0) goto LAB_00125340;
    cVar12 = *__nptr;
  }
  if (cVar12 == '\0') {
    return 0;
  }
  if ((-1 < (int)uVar13) && (uVar13 <= dst->_prefix_len)) {
    dst->_prefix_len = (uint8_t)uVar13;
    return 0;
  }
LAB_00125340:
  dst->_type = '\0';
  return -1;
}

Assistant:

int
netaddr_from_string(struct netaddr *dst, const char *src) {
  struct netaddr_str buf;
  unsigned int colon_count, minus_count;
  int result;
  int prefix_len;
  bool has_coloncolon, has_point;
  bool last_was_colon;
  char *ptr1, *ptr2, *ptr3;
  size_t i;

  memset(dst, 0, sizeof(*dst));

  if (strcmp(src, "-") == 0) {
    /* unspec */
    netaddr_invalidate(dst);
    return 0;
  }

  /* handle string representations of prefixes */
  for (i = 0; i < ARRAYSIZE(_known_prefixes); i++) {
    if (strcasecmp(src, _known_prefixes[i].name) == 0) {
      memcpy(dst, _known_prefixes[i].prefix, sizeof(*dst));
      return 0;
    }
  }

  colon_count = 0;
  minus_count = 0;
  has_coloncolon = false;
  has_point = false;

  last_was_colon = false;

  result = -1;
  prefix_len = -1;

  /* copy input string in temporary buffer */
  strscpy(buf.buf, src, sizeof(buf));
  ptr1 = buf.buf;

  ptr1 = str_trim(ptr1);

  ptr2 = ptr1;
  while (*ptr2 != 0 && !isspace(*ptr2) && *ptr2 != '/') {
    switch (*ptr2) {
      case ':':
        if (last_was_colon) {
          has_coloncolon = true;
        }
        colon_count++;
        break;

      case '.':
        has_point = true;
        break;

      case '-':
        minus_count++;
        break;

      default:
        break;
    }
    last_was_colon = *ptr2++ == ':';
  }

  if (*ptr2) {
    /* split strings */
    while (isspace(*ptr2))
      *ptr2++ = 0;
    if (*ptr2 == '/') {
      *ptr2++ = 0;
    }
    while (isspace(*ptr2))
      *ptr2++ = 0;

    if (*ptr2 == 0) {
      /* prefixlength is missing */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* try to read numeric prefix length */
    prefix_len = (int)strtoul(ptr2, &ptr3, 10);
    if (ptr3 && *ptr3) {
      /* not a numeric prefix length */
      prefix_len = -1;
    }
  }

  /* use dst->prefix_len as storage for maximum prefixlen */
  if ((colon_count == 5 || minus_count == 5) && (colon_count == 0 || minus_count == 0) && !has_point &&
      !has_coloncolon) {
    dst->_type = AF_MAC48;
    dst->_prefix_len = 48;
    if (colon_count > 0) {
      result = _bin_from_hex(dst->_addr, 6, ptr1, ':');
    }
    else {
      result = _bin_from_hex(dst->_addr, 6, ptr1, '-');
    }
  }
  else if (colon_count == 0 && !has_point && minus_count == 7) {
    dst->_type = AF_EUI64;
    dst->_prefix_len = 64;
    dst->_addr[7] = 2;
    result = _bin_from_hex(dst->_addr, 8, ptr1, '-');
  }
  else if (colon_count == 0 && has_point && minus_count == 0) {
    dst->_type = AF_INET;
    dst->_prefix_len = 32;
    result = inet_pton(AF_INET, ptr1, dst->_addr) == 1 ? 0 : -1;

    if (result == 0 && *ptr2 && prefix_len == -1) {
      /* we need a prefix length, but its not a numerical one */
      prefix_len = _subnetmask_to_prefixlen(ptr2);
    }
  }
  else if ((has_coloncolon || colon_count == 7) && minus_count == 0) {
    dst->_type = AF_INET6;
    dst->_prefix_len = 128;
    result = inet_pton(AF_INET6, ptr1, dst->_addr) == 1 ? 0 : -1;
  }
  else if (minus_count == 4 && colon_count == 0 && !has_point) {
    dst->_type = AF_UUID;
    dst->_prefix_len = 128;
    result = _uuid_from_string(dst->_addr, sizeof(dst->_addr), ptr1);
  }

  /* stop if an error happened */
  if (result) {
    dst->_type = AF_UNSPEC;
    return -1;
  }

  if (*ptr2) {
    if (prefix_len < 0 || prefix_len > dst->_prefix_len) {
      /* prefix is too long */
      dst->_type = AF_UNSPEC;
      return -1;
    }

    /* store real prefix length */
    dst->_prefix_len = (uint8_t)prefix_len;
  }
  return 0;
}